

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidatorTests.cpp
# Opt level: O2

int testBayesianProbitRegressionValidationBasic(void)

{
  bool bVar1;
  ArrayFeatureType *this;
  FeatureType *this_00;
  ArrayFeatureType *this_01;
  FeatureType *this_02;
  ModelDescription *this_03;
  FeatureDescription *pFVar2;
  FeatureDescription *pFVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  Result result;
  Model model;
  undefined1 local_58 [40];
  
  this = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this);
  CoreML::Specification::ArrayFeatureType::add_shape(this,10);
  CoreML::Specification::ArrayFeatureType::add_shape(this,10);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_00,this);
  this_01 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_01);
  CoreML::Specification::ArrayFeatureType::add_shape(this_01,10);
  this_02 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_02);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_02,this_01);
  this_03 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_03);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&this_03->input_);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&this_03->output_);
  if (pFVar2->type_ != (FeatureType *)0x0) {
    (*(pFVar2->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar2->type_ = this_00;
  if (pFVar3->type_ != (FeatureType *)0x0) {
    (*(pFVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar3->type_ = this_02;
  CoreML::Specification::Model::Model(&model);
  if (model.description_ != (ModelDescription *)0x0) {
    (*((model.description_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  model.description_ = this_03;
  CoreML::validate<(MLModelType)304>(&result,&model);
  bVar1 = CoreML::Result::good(&result);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/BayesianProbitRegressionValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x2b);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = "!((result).good())";
  }
  else {
    this->datatype_ = 0x20020;
    CoreML::validate<(MLModelType)304>((Result *)local_58,&model);
    CoreML::Result::operator=(&result,(Result *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    bVar1 = CoreML::Result::good(&result);
    iVar5 = 0;
    if (bVar1) goto LAB_001319ca;
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/BayesianProbitRegressionValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x30);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = "(result).good()";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar5 = 1;
LAB_001319ca:
  std::__cxx11::string::~string((string *)&result.m_message);
  CoreML::Specification::Model::~Model(&model);
  return iVar5;
}

Assistant:

int testBayesianProbitRegressionValidationBasic () {

    Specification::ArrayFeatureType* inputArrayFeatureType = new Specification::ArrayFeatureType();
    inputArrayFeatureType->add_shape(10);
    inputArrayFeatureType->add_shape(10);

    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_multiarraytype(inputArrayFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    outputArrayFeatureType->add_shape(10);

    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_bayesianProbitRegressor>(model);
    ML_ASSERT_BAD(result);

    inputArrayFeatureType->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);

    result = validate<MLModelType_bayesianProbitRegressor>(model);
    ML_ASSERT_GOOD(result);

    return 0;
}